

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABB.cpp
# Opt level: O2

bool chrono::collision::CHAABB::AABB_Overlap(ChMatrix33<double> *B,Vector *T,CHAABB *b1,CHAABB *b2)

{
  double dVar1;
  undefined1 auVar2 [64];
  bool bVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMatrix33<double> Bf;
  Vector local_68;
  undefined1 local_48 [64];
  double local_8;
  
  auVar4 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
  auVar2 = *(undefined1 (*) [64])
            (B->super_Matrix<double,_3,_3,_1,_3,_3>).
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array;
  auVar5 = vxorpd_avx512dq(auVar2,auVar4);
  auVar5 = vmaxpd_avx512f(auVar5,auVar2);
  auVar2._8_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._0_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._16_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._24_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._32_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._40_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._48_8_ = 0x3eb0c6f7a0b5ed8d;
  auVar2._56_8_ = 0x3eb0c6f7a0b5ed8d;
  local_48 = vaddpd_avx512f(auVar5,auVar2);
  dVar1 = (B->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar7._0_8_ = (ulong)dVar1 ^ auVar4._0_8_;
  auVar7._8_8_ = auVar4._8_8_;
  auVar6 = vmaxsd_avx(auVar7,auVar6);
  local_8 = auVar6._0_8_ + 1e-06;
  local_68.m_data[0] = T->m_data[0];
  local_68.m_data[1] = T->m_data[1];
  local_68.m_data[2] = T->m_data[2];
  bVar3 = AABB_Overlap(B,(ChMatrix33<double> *)local_48,&local_68,b1,b2);
  return bVar3;
}

Assistant:

bool CHAABB::AABB_Overlap(ChMatrix33<>& B, Vector T, CHAABB* b1, CHAABB* b2) {
    ChMatrix33<> Bf;
    const double reps = (double)1e-6;

    // Bf = fabs(B)
    Bf(0, 0) = myfabs(B(0, 0));
    Bf(0, 0) += reps;
    Bf(0, 1) = myfabs(B(0, 1));
    Bf(0, 1) += reps;
    Bf(0, 2) = myfabs(B(0, 2));
    Bf(0, 2) += reps;
    Bf(1, 0) = myfabs(B(1, 0));
    Bf(1, 0) += reps;
    Bf(1, 1) = myfabs(B(1, 1));
    Bf(1, 1) += reps;
    Bf(1, 2) = myfabs(B(1, 2));
    Bf(1, 2) += reps;
    Bf(2, 0) = myfabs(B(2, 0));
    Bf(2, 0) += reps;
    Bf(2, 1) = myfabs(B(2, 1));
    Bf(2, 1) += reps;
    Bf(2, 2) = myfabs(B(2, 2));
    Bf(2, 2) += reps;

    return AABB_Overlap(B, Bf, T, b1, b2);
}